

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_common2<double>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,TagBase *tagbase,Write<double> *new_data)

{
  Int width;
  Read<double> same_data;
  Read<double> old_data;
  Write<double> local_c0;
  Write<double> local_b0;
  Write<int> local_a0;
  Write<double> local_90;
  Write<double> local_80;
  Write<int> local_70;
  Write<signed_char> local_60;
  Write<double> local_50;
  
  TagBase::name_abi_cxx11_(tagbase);
  width = TagBase::ncomps(tagbase);
  Mesh::get_array<double>
            ((Mesh *)&stack0xffffffffffffffc0,(Int)old_mesh,(string *)(ulong)(uint)ent_dim);
  Write<int>::Write(&local_70,&same_ents2old_ents->write_);
  Write<double>::Write(&local_80,(Write<double> *)&stack0xffffffffffffffc0);
  unmap<double>((Omega_h *)&local_60,(LOs *)&local_70,(Read<signed_char> *)&local_80,width);
  read<double>((Omega_h *)&local_50,&local_60);
  Write<double>::~Write((Write<double> *)&local_60);
  Write<double>::~Write(&local_80);
  Write<int>::~Write(&local_70);
  Write<double>::Write(&local_90,&local_50);
  Write<int>::Write(&local_a0,&same_ents2new_ents->write_);
  Write<double>::Write(&local_b0,new_data);
  map_into<double>((Read<signed_char> *)&local_90,(LOs *)&local_a0,(Write<signed_char> *)&local_b0,
                   width);
  Write<double>::~Write(&local_b0);
  Write<int>::~Write(&local_a0);
  Write<double>::~Write(&local_90);
  Write<double>::Write(&local_c0,new_data);
  transfer_common3<double>(new_mesh,ent_dim,tagbase,&local_c0);
  Write<double>::~Write(&local_c0);
  Write<double>::~Write(&local_50);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void transfer_common2(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, TagBase const* tagbase,
    Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  auto old_data = old_mesh->get_array<T>(ent_dim, name);
  auto same_data = read(unmap(same_ents2old_ents, old_data, ncomps));
  map_into(same_data, same_ents2new_ents, new_data, ncomps);
  transfer_common3(new_mesh, ent_dim, tagbase, new_data);
}